

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaeger_types.cpp
# Opt level: O3

void __thiscall jaegertracing::thrift::Tag::printTo(Tag *this,ostream *out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_01;
  char *local_1b8;
  long local_1b0;
  char local_1a8 [16];
  string local_198 [3];
  ios_base local_128 [264];
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"Tag(",4);
  std::__ostream_insert<char,std::char_traits<char>>(out,"key=",4);
  apache::thrift::to_string<std::__cxx11::string>(local_198,(thrift *)&this->key,t);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_198[0]._M_dataplus._M_p,local_198[0]._M_string_length);
  paVar1 = &local_198[0].field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_198[0]._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"vType=",6);
  apache::thrift::to_string<jaegertracing::thrift::TagType::type>(local_198,&this->vType);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_198[0]._M_dataplus._M_p,local_198[0]._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_198[0]._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"vStr=",5);
  if (((byte)this->__isset & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    apache::thrift::to_string<std::__cxx11::string>(local_198,(thrift *)&this->vStr,t_00);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_198[0]._M_dataplus._M_p,local_198[0]._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_198[0]._M_dataplus._M_p);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"vDouble=",8);
  if (((byte)this->__isset & 2) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    *(undefined8 *)
     ((long)&local_198[0]._M_string_length + *(long *)(local_198[0]._M_dataplus._M_p + -0x18)) =
         0x11;
    std::ostream::_M_insert<double>(this->vDouble);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base(local_128);
    std::__ostream_insert<char,std::char_traits<char>>(out,local_1b8,local_1b0);
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"vBool=",6);
  if (((byte)this->__isset & 4) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    apache::thrift::to_string<bool>(local_198,&this->vBool);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_198[0]._M_dataplus._M_p,local_198[0]._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_198[0]._M_dataplus._M_p);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"vLong=",6);
  if (((byte)this->__isset & 8) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    apache::thrift::to_string<long>(local_198,&this->vLong);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_198[0]._M_dataplus._M_p,local_198[0]._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_198[0]._M_dataplus._M_p);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"vBinary=",8);
  if (((byte)this->__isset & 0x10) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<null>",6);
  }
  else {
    apache::thrift::to_string<std::__cxx11::string>(local_198,(thrift *)&this->vBinary,t_01);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_198[0]._M_dataplus._M_p,local_198[0]._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_198[0]._M_dataplus._M_p);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
  return;
}

Assistant:

void Tag::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "Tag(";
  out << "key=" << to_string(key);
  out << ", " << "vType=" << to_string(vType);
  out << ", " << "vStr="; (__isset.vStr ? (out << to_string(vStr)) : (out << "<null>"));
  out << ", " << "vDouble="; (__isset.vDouble ? (out << to_string(vDouble)) : (out << "<null>"));
  out << ", " << "vBool="; (__isset.vBool ? (out << to_string(vBool)) : (out << "<null>"));
  out << ", " << "vLong="; (__isset.vLong ? (out << to_string(vLong)) : (out << "<null>"));
  out << ", " << "vBinary="; (__isset.vBinary ? (out << to_string(vBinary)) : (out << "<null>"));
  out << ")";
}